

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int encode_binary_constructor
              (AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,_Bool use_smallest)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  undefined7 in_register_00000011;
  char *pcVar4;
  uchar local_a [2];
  
  if ((int)CONCAT71(in_register_00000011,use_smallest) == 0) {
    local_a[1] = 0xb0;
    iVar1 = (*encoder_output)(context,local_a + 1,1);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xd5b;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xd5b;
    }
    pcVar4 = "Failed encoding large binary constructor";
    iVar3 = 0xd5a;
  }
  else {
    local_a[0] = 0xa0;
    iVar1 = (*encoder_output)(context,local_a,1);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xd4c;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xd4c;
    }
    pcVar4 = "Failed encoding small binary constructor";
    iVar3 = 0xd4b;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"encode_binary_constructor",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

static int encode_binary_constructor(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, bool use_smallest)
{
    int result;
    if (use_smallest)
    {
        /* Codes_SRS_AMQPVALUE_01_297: [<encoding name="vbin8" code="0xa0" category="variable" width="1" label="up to 2^8 - 1 octets of binary data"/>] */
        if (output_byte(encoder_output, context, 0xA0) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding small binary constructor");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_298: [<encoding name="vbin32" code="0xb0" category="variable" width="4" label="up to 2^32 - 1 octets of binary data"/>] */
        if (output_byte(encoder_output, context, 0xB0) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding large binary constructor");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    return result;
}